

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  time_t tVar1;
  fnet_socket_t in_EDI;
  double dVar2;
  char data [256];
  time_t time_now;
  size_t i;
  time_t last_time;
  fnode_service_t *service;
  uint32_t in_stack_000002d4;
  char *in_stack_000002d8;
  fnode_service_t *in_stack_000002e0;
  fnode_service_t *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  char *__s;
  float local_13c;
  undefined1 local_138 [304];
  fnet_socket_t local_8;
  fnet_socket_t local_4;
  
  local_4 = 0;
  local_8 = in_EDI;
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  if ((int)local_8 < 2) {
    fprintf(_stderr,"Usage: test-cocl SERIAL-NUMBER\n");
  }
  else {
    local_138._288_8_ =
         fnode_service_create(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
    if ((fnode_service_t *)local_138._288_8_ != (fnode_service_t *)0x0) {
      fnode_service_reg_handler((fnode_service_t *)local_138._288_8_,handler);
      local_138._280_8_ = 0;
      local_138._272_8_ = 0;
      do {
        do {
          fnode_service_update(in_stack_fffffffffffffeb0);
          local_138._264_8_ = time((time_t *)0x0);
        } while ((long)(local_138._264_8_ - local_138._280_8_) < 2);
        __s = local_138;
        local_13c = (float)(ulong)local_138._272_8_;
        dVar2 = sin((double)(local_13c * 0.1));
        snprintf(__s,0x100,"%d%d",0,(ulong)(uint)(int)(dVar2 * 30.0));
        in_stack_fffffffffffffeb0 = (fnode_service_t *)local_138;
        strlen(local_138);
        fnode_service_notify_state(in_stack_000002e0,in_stack_000002d8,in_stack_000002d4);
        local_138._280_8_ = local_138._264_8_;
        local_138._272_8_ = local_138._272_8_ + 1;
      } while( true );
    }
    fprintf(_stderr,"Failed to create COCL service\n");
  }
  return -1;
}

Assistant:

int main(int argc, char ** argv)
{
    srand(time(0));

    if (argc < 2)
    {
        fprintf(stderr, "Usage: test-cocl SERIAL-NUMBER\n");
        return -1;
    }

    fnode_service_t * service = fnode_service_create(argv[1], "TADC");
    if ( !service )
    {
        fprintf(stderr, "Failed to create COCL service\n");
        return -1;
    }

    fnode_service_reg_handler(service, handler);

    time_t last_time = 0;
    size_t i = 0;

    for(;;)
    {
        fnode_service_update(service);

        time_t time_now = time(0);
        if (time_now - last_time > 1)
        {
            char data[256];
            snprintf(data, sizeof data, "%d%d",
                    0,
                    (int)(30 * sin(i * 0.1f)));
            fnode_service_notify_state(service, data, strlen(data));
            last_time = time_now;
            ++i;
        }
    }

    fnode_service_release(service);
    return 0;
}